

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNamesImpl::loadStrings
          (TimeZoneNamesImpl *this,UnicodeString *tzCanonicalID,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  StringEnumeration *pSVar3;
  undefined4 extraout_var_00;
  bool bVar4;
  UnicodeString *mzID;
  LocalPointerBase<icu_63::StringEnumeration> local_28;
  LocalPointer<icu_63::StringEnumeration> mzIDs;
  UErrorCode *status_local;
  UnicodeString *tzCanonicalID_local;
  TimeZoneNamesImpl *this_local;
  
  mzIDs.super_LocalPointerBase<icu_63::StringEnumeration>.ptr =
       (LocalPointerBase<icu_63::StringEnumeration>)
       (LocalPointerBase<icu_63::StringEnumeration>)status;
  loadTimeZoneNames(this,tzCanonicalID,status);
  iVar2 = (*(this->super_TimeZoneNames).super_UObject._vptr_UObject[6])
                    (this,tzCanonicalID,mzIDs.super_LocalPointerBase<icu_63::StringEnumeration>.ptr)
  ;
  LocalPointer<icu_63::StringEnumeration>::LocalPointer
            ((LocalPointer<icu_63::StringEnumeration> *)&local_28,
             (StringEnumeration *)CONCAT44(extraout_var,iVar2));
  UVar1 = ::U_FAILURE(*(UErrorCode *)mzIDs.super_LocalPointerBase<icu_63::StringEnumeration>.ptr);
  if (UVar1 == '\0') {
    while( true ) {
      pSVar3 = LocalPointerBase<icu_63::StringEnumeration>::operator->(&local_28);
      iVar2 = (*(pSVar3->super_UObject)._vptr_UObject[7])
                        (pSVar3,mzIDs.super_LocalPointerBase<icu_63::StringEnumeration>.ptr);
      bVar4 = false;
      if ((UnicodeString *)CONCAT44(extraout_var_00,iVar2) != (UnicodeString *)0x0) {
        UVar1 = ::U_SUCCESS(*(UErrorCode *)
                             mzIDs.super_LocalPointerBase<icu_63::StringEnumeration>.ptr);
        bVar4 = UVar1 != '\0';
      }
      if (!bVar4) break;
      loadMetaZoneNames(this,(UnicodeString *)CONCAT44(extraout_var_00,iVar2),
                        (UErrorCode *)mzIDs.super_LocalPointerBase<icu_63::StringEnumeration>.ptr);
    }
  }
  LocalPointer<icu_63::StringEnumeration>::~LocalPointer
            ((LocalPointer<icu_63::StringEnumeration> *)&local_28);
  return;
}

Assistant:

void
TimeZoneNamesImpl::loadStrings(const UnicodeString& tzCanonicalID, UErrorCode& status) {
    loadTimeZoneNames(tzCanonicalID, status);
    LocalPointer<StringEnumeration> mzIDs(getAvailableMetaZoneIDs(tzCanonicalID, status));
    if (U_FAILURE(status)) { return; }
    U_ASSERT(!mzIDs.isNull());

    const UnicodeString *mzID;
    while (((mzID = mzIDs->snext(status)) != NULL) && U_SUCCESS(status)) {
        loadMetaZoneNames(*mzID, status);
    }
}